

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O2

bool __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::CheckEnumGeneral
          (BlendMaskStateMachine *this,GLenum e,GLenum s)

{
  ostringstream *this_00;
  bool bVar1;
  GLboolean b;
  GLfloat f;
  GLint i;
  GLint64 li;
  GLboolean local_1b1;
  float local_1b0;
  GLenum local_1ac;
  GLenum local_1a8 [2];
  undefined1 local_1a0 [384];
  
  (*this->gl->getIntegerv)(e,(GLint *)&local_1ac);
  (*this->gl->getInteger64v)(e,(GLint64 *)local_1a8);
  (*this->gl->getBooleanv)(e,&local_1b1);
  (*this->gl->getFloatv)(e,&local_1b0);
  if ((((local_1ac != s) || (local_1a8[0] != s)) || ((GLenum)(long)local_1b0 != s)) ||
     (bVar1 = true, (bool)local_1b1 != (s != 0))) {
    local_1a0._0_8_ = this->testLog;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"General state should be set to ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00," but found the following values:\n");
    std::operator<<((ostream *)this_00,"int: ");
    std::ostream::operator<<(this_00,local_1ac);
    std::operator<<((ostream *)this_00,"\n");
    std::operator<<((ostream *)this_00,"int64: ");
    std::ostream::_M_insert<long>((long)this_00);
    std::operator<<((ostream *)this_00,"\n");
    std::operator<<((ostream *)this_00,"bool: ");
    std::operator<<((ostream *)this_00,local_1b1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DrawBuffersIndexedBase::BlendMaskStateMachine::CheckEnumGeneral(glw::GLenum e, glw::GLenum s)
{
	glw::GLint	 i;
	glw::GLint64   li;
	glw::GLboolean b;
	glw::GLfloat   f;

	gl.getIntegerv(e, &i);
	gl.getInteger64v(e, &li);
	gl.getBooleanv(e, &b);
	gl.getFloatv(e, &f);
	if ((static_cast<glw::GLenum>(i) != s) || (static_cast<glw::GLenum>(li) != s) ||
		(static_cast<glw::GLenum>(f) != s) || (b != (s ? GL_TRUE : GL_FALSE)))
	{
		testLog << tcu::TestLog::Message << "General state should be set to " << s
				<< " but found the following values:\n"
				<< "int: " << i << "\n"
				<< "int64: " << li << "\n"
				<< "bool: " << b << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}